

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

Error __thiscall asmjit::BaseBuilder::runPasses(BaseBuilder *this)

{
  Zone *this_00;
  uint uVar1;
  ErrorHandler *errorHandler;
  void *pvVar2;
  long *plVar3;
  undefined8 uVar4;
  Error err;
  Error EVar5;
  undefined8 message;
  long lVar6;
  PostponedErrorHandler postponed;
  
  if ((this->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    EVar5 = 5;
  }
  else if ((this->_passes).super_ZoneVectorBase._size == 0) {
    EVar5 = 0;
  }
  else {
    errorHandler = (this->super_BaseEmitter)._errorHandler;
    PostponedErrorHandler::PostponedErrorHandler(&postponed);
    BaseEmitter::setErrorHandler(&this->super_BaseEmitter,&postponed.super_ErrorHandler);
    pvVar2 = (this->_passes).super_ZoneVectorBase._data;
    uVar1 = (this->_passes).super_ZoneVectorBase._size;
    this_00 = &this->_passZone;
    lVar6 = 0;
    do {
      if ((ulong)uVar1 << 3 == lVar6) {
        err = 0;
        break;
      }
      plVar3 = *(long **)((long)pvVar2 + lVar6);
      Zone::reset(this_00,0);
      err = (**(code **)(*plVar3 + 0x10))(plVar3,this_00,(this->super_BaseEmitter)._logger);
      lVar6 = lVar6 + 8;
    } while (err == 0);
    EVar5 = 0;
    Zone::reset(this_00,0);
    BaseEmitter::setErrorHandler(&this->super_BaseEmitter,errorHandler);
    if (err != 0) {
      message = postponed._message.super_String.field_0._small.data;
      uVar4 = (ulong)postponed._message.super_String.field_0._type;
      if (0x1e < (ulong)postponed._message.super_String.field_0._type) {
        message = postponed._message.super_String.field_0._large.data;
        uVar4 = postponed._message.super_String.field_0._large.size;
      }
      if (uVar4 == 0) {
        message = (char *)0x0;
      }
      EVar5 = BaseEmitter::reportError(&this->super_BaseEmitter,err,(char *)message);
    }
    PostponedErrorHandler::~PostponedErrorHandler(&postponed);
  }
  return EVar5;
}

Assistant:

Error BaseBuilder::runPasses() {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  if (_passes.empty())
    return kErrorOk;

  ErrorHandler* prev = errorHandler();
  PostponedErrorHandler postponed;

  Error err = kErrorOk;
  setErrorHandler(&postponed);

  for (Pass* pass : _passes) {
    _passZone.reset();
    err = pass->run(&_passZone, _logger);
    if (err)
      break;
  }
  _passZone.reset();
  setErrorHandler(prev);

  if (ASMJIT_UNLIKELY(err))
    return reportError(err, !postponed._message.empty() ? postponed._message.data() : nullptr);

  return kErrorOk;
}